

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DLevelScript::Link(DLevelScript *this)

{
  DACSThinker *pointing;
  DACSThinker *controller;
  DLevelScript *this_local;
  
  pointing = ::TObjPtr::operator_cast_to_DACSThinker_((TObjPtr *)&DACSThinker::ActiveThinker);
  this->next = pointing->Scripts;
  GC::WriteBarrier(&this->super_DObject,&this->next->super_DObject);
  if (pointing->Scripts != (DLevelScript *)0x0) {
    pointing->Scripts->prev = this;
    GC::WriteBarrier(&pointing->Scripts->super_DObject,&this->super_DObject);
  }
  this->prev = (DLevelScript *)0x0;
  pointing->Scripts = this;
  GC::WriteBarrier((DObject *)pointing,&this->super_DObject);
  if (pointing->LastScript == (DLevelScript *)0x0) {
    pointing->LastScript = this;
  }
  return;
}

Assistant:

void DLevelScript::Link ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	next = controller->Scripts;
	GC::WriteBarrier(this, next);
	if (controller->Scripts)
	{
		controller->Scripts->prev = this;
		GC::WriteBarrier(controller->Scripts, this);
	}
	prev = NULL;
	controller->Scripts = this;
	GC::WriteBarrier(controller, this);
	if (controller->LastScript == NULL)
	{
		controller->LastScript = this;
	}
}